

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

patch_op duckdb_yyjson::patch_op_get(yyjson_val *op)

{
  int *__s1;
  int iVar1;
  patch_op pVar2;
  ulong uVar3;
  
  uVar3 = op->tag >> 8;
  pVar2 = PATCH_OP_NONE;
  if (uVar3 - 3 < 5) {
    __s1 = (int *)(op->uni).ptr;
    switch(uVar3) {
    case 3:
      iVar1 = bcmp(__s1,"add",3);
      pVar2 = PATCH_OP_NONE;
      if (iVar1 == 0) {
        pVar2 = PATCH_OP_ADD;
      }
      break;
    case 4:
      if (*__s1 == 0x65766f6d) {
        pVar2 = PATCH_OP_MOVE;
      }
      else if (*__s1 == 0x79706f63) {
        pVar2 = PATCH_OP_COPY;
      }
      else {
        pVar2 = (*__s1 != 0x74736574) + PATCH_OP_TEST;
      }
      break;
    case 6:
      iVar1 = bcmp(__s1,"remove",6);
      pVar2 = (uint)(iVar1 != 0) * 5 + PATCH_OP_REMOVE;
      break;
    case 7:
      iVar1 = bcmp(__s1,"replace",7);
      pVar2 = (uint)(iVar1 != 0) * 4 + PATCH_OP_REPLACE;
    }
  }
  return pVar2;
}

Assistant:

static patch_op patch_op_get(yyjson_val *op) {
    const char *str = op->uni.str;
    switch (unsafe_yyjson_get_len(op)) {
        case 3:
            if (!memcmp(str, "add", 3)) return PATCH_OP_ADD;
            return PATCH_OP_NONE;
        case 4:
            if (!memcmp(str, "move", 4)) return PATCH_OP_MOVE;
            if (!memcmp(str, "copy", 4)) return PATCH_OP_COPY;
            if (!memcmp(str, "test", 4)) return PATCH_OP_TEST;
            return PATCH_OP_NONE;
        case 6:
            if (!memcmp(str, "remove", 6)) return PATCH_OP_REMOVE;
            return PATCH_OP_NONE;
        case 7:
            if (!memcmp(str, "replace", 7)) return PATCH_OP_REPLACE;
            return PATCH_OP_NONE;
        default:
            return PATCH_OP_NONE;
    }
}